

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_desc_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  string *__str;
  Option *opt_local;
  Formatter *this_local;
  
  __str = Option::get_description_abi_cxx11_(opt);
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_desc(const Option *opt) const { return opt->get_description(); }